

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_x86_mov8IntoMemoryWithOffset
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,int32_t offset,
               sysbvm_x86_register_t source)

{
  uint8_t local_26 [3];
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_20;
  uint8_t local_1f;
  uint8_t instruction_1 [7];
  uint8_t instruction [3];
  sysbvm_x86_register_t source_local;
  int32_t offset_local;
  sysbvm_x86_register_t destination_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  instruction_1._2_4_ = source;
  unique0x100000cf = offset;
  if ((offset == 0) && (destination != SYSBVM_X86_EBP)) {
    local_1f = sysbvm_jit_x86_rex(true,SYSBVM_X86_64_ARG0 < source,false,
                                  SYSBVM_X86_64_ARG0 < destination);
    instruction_1[0] = 0x88;
    instruction_1[1] = sysbvm_jit_x86_modRM((int8_t)destination,(uint8_t)instruction_1._2_4_,'\0');
    sysbvm_bytecodeJit_addBytes(jit,3,&local_1f);
  }
  else {
    local_26[0] = sysbvm_jit_x86_rex(true,SYSBVM_X86_64_ARG0 < source,false,
                                     SYSBVM_X86_64_ARG0 < destination);
    local_26[1] = 0x88;
    local_26[2] = sysbvm_jit_x86_modRM((int8_t)destination,(uint8_t)instruction_1._2_4_,'\x02');
    local_23 = (undefined1)stack0xffffffffffffffe8;
    local_22 = (undefined1)((uint)stack0xffffffffffffffe8 >> 8);
    local_21 = (undefined1)((uint)stack0xffffffffffffffe8 >> 0x10);
    local_20 = (undefined1)((uint)stack0xffffffffffffffe8 >> 0x18);
    sysbvm_bytecodeJit_addBytes(jit,7,local_26);
  }
  return;
}

Assistant:

static void sysbvm_jit_x86_mov8IntoMemoryWithOffset(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, int32_t offset, sysbvm_x86_register_t source)
{
    if(offset == 0 && destination != SYSBVM_X86_RBP)
    {
        uint8_t instruction[] = {
            sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
            0x88,
            sysbvm_jit_x86_modRM(destination, source, 0),
        };

        sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
    }
    else
    {
        uint8_t instruction[] = {
            sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
            0x88,
            sysbvm_jit_x86_modRM(destination, source, 2),
            offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
        };

        sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
    }
}